

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

vector<std::byte,_std::allocator<std::byte>_> *
ParseHex<std::byte>(vector<std::byte,_std::allocator<std::byte>_> *__return_storage_ptr__,
                   string_view hex_str)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  _Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *p_Var4;
  long in_FS_OFFSET;
  _Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> local_58;
  _Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  TryParseHex<std::byte>
            ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)&local_38,hex_str);
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var4 = &local_58;
  if (local_38._M_engaged != false) {
    p_Var4 = &local_38._M_payload;
  }
  pbVar1 = (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value
           ).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value).
  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar2 = (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value
           ).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar3 = (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value
           ).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value).
  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (((_Storage<std::vector<std::byte,_std::allocator<std::byte>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<std::byte,_std::allocator<std::byte>_>)->_M_value).
  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_start = pbVar2;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_finish = pbVar3;
  (__return_storage_ptr__->super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pbVar1;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&local_58._M_value.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Optional_payload_base<std::vector<std::byte,_std::allocator<std::byte>_>_>::_M_reset
            (&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}